

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::AV1LbdInvTxfm2d_DISABLED_Speed_Test::~AV1LbdInvTxfm2d_DISABLED_Speed_Test
          (AV1LbdInvTxfm2d_DISABLED_Speed_Test *this)

{
  anon_unknown.dwarf_1612e9d::AV1LbdInvTxfm2d_DISABLED_Speed_Test::
  ~AV1LbdInvTxfm2d_DISABLED_Speed_Test((AV1LbdInvTxfm2d_DISABLED_Speed_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, DISABLED_Speed) {
  for (int j = 1; j < (int)(TX_SIZES_ALL); ++j) {
    for (int i = 0; i < (int)TX_TYPES; ++i) {
      if (libaom_test::IsTxSizeTypeValid(static_cast<TxSize>(j),
                                         static_cast<TxType>(i))) {
        RunAV1InvTxfm2dTest(static_cast<TxType>(i), static_cast<TxSize>(j),
                            10000000);
      }
    }
  }
}